

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O3

void __thiscall CVmObjIterIdx::mark_refs(CVmObjIterIdx *this,uint state)

{
  char *buf;
  vm_val_t coll;
  vm_val_t local_20;
  
  buf = (this->super_CVmObjIter).super_CVmObject.ext_;
  local_20.typ = (vm_datatype_t)*buf;
  vmb_get_dh_val(buf,&local_20);
  if (local_20.typ == VM_OBJ) {
    CVmObjTable::add_to_gc_queue(&G_obj_table_X,local_20.val.obj,state);
  }
  return;
}

Assistant:

void CVmObjIterIdx::mark_refs(VMG_ uint state)
{
    vm_val_t coll;
    
    /* if my collection is an object, mark it as referenced */
    get_coll_val(&coll);
    if (coll.typ == VM_OBJ)
        G_obj_table->mark_all_refs(coll.val.obj, state);
}